

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseHexaLiteral(char *in,char *end,Value **data)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Value *pVVar4;
  uint local_40;
  int v;
  int value;
  int pos;
  char *start;
  bool ok;
  Value **data_local;
  char *end_local;
  char *in_local;
  
  *data = (Value *)0x0;
  in_local = in;
  if ((((in != (char *)0x0) && (in_local = in, in != end)) &&
      (_value = lookForNextToken<char>(in,end), in_local = _value, *_value == '0')) &&
     ((in_local = _value + 1, *in_local == 'x' || (*in_local == 'X')))) {
    bVar1 = true;
    v = 0;
    _value = _value + 2;
    for (end_local = _value; bVar2 = isSeparator<char>(*end_local), !bVar2 && end_local != end;
        end_local = end_local + 1) {
      if ((((*end_local < '0') && ('9' < *end_local)) || ((*end_local < 'a' && ('f' < *end_local))))
         || ((*end_local < 'A' && ('F' < *end_local)))) {
        bVar1 = false;
        break;
      }
      v = v + 1;
    }
    if (bVar1) {
      local_40 = 0;
      for (; 0 < v; v = v + -1) {
        uVar3 = hex2Decimal(*_value);
        local_40 = local_40 << 4 | uVar3;
        _value = _value + 1;
      }
      pVVar4 = ValueAllocator::allocPrimData(ddl_unsigned_int64,1);
      *data = pVVar4;
      if (*data != (Value *)0x0) {
        Value::setUnsignedInt64(*data,(long)(int)local_40);
      }
      in_local = end_local;
    }
    else {
      in_local = end_local;
    }
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseHexaLiteral( char *in, char *end, Value **data ) {
    *data = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in != '0' ) {
        return in;
    }

    ++in;
    if( *in != 'x' && *in != 'X' ) {
        return in;
    }

    ++in;
    bool ok( true );
    char *start( in );
    int pos( 0 );
    while( !isSeparator( *in ) && in != end ) {
        if( ( *in < '0' && *in > '9' ) || ( *in < 'a' && *in > 'f' ) || ( *in < 'A' && *in > 'F' ) ) {
            ok = false;
            break;
        }
        ++pos;
        ++in;
    }

    if( !ok ) {
        return in;
    }

    int value( 0 );
    while( pos > 0 ) {
        int v = hex2Decimal( *start );
        --pos;
        value = ( value << 4 ) | v;
        ++start;
    }

    *data = ValueAllocator::allocPrimData( Value::ddl_unsigned_int64 );
    if( ddl_nullptr != *data ) {
        ( *data )->setUnsignedInt64( value );
    }

    return in;
}